

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS ref_node_store_aux(REF_NODE ref_node,REF_INT ldim,REF_DBL *aux)

{
  uint uVar1;
  uint uVar2;
  REF_GLOB *pRVar3;
  REF_DBL *pRVar4;
  REF_STATUS RVar5;
  ulong uVar6;
  char *pcVar7;
  int iVar8;
  ulong uVar9;
  
  ref_node->naux = ldim;
  if (ref_node->aux != (REF_DBL *)0x0) {
    free(ref_node->aux);
    ref_node->aux = (REF_DBL *)0x0;
  }
  uVar1 = ref_node->max;
  uVar2 = ref_node->naux;
  if ((int)(uVar1 * uVar2) < 0) {
    RVar5 = 1;
    pcVar7 = "malloc ref_node->aux of REF_DBL negative";
  }
  else {
    pRVar4 = (REF_DBL *)malloc((ulong)(uVar1 * uVar2) << 3);
    ref_node->aux = pRVar4;
    if (pRVar4 != (REF_DBL *)0x0) {
      if (0 < (int)uVar1) {
        pRVar3 = ref_node->global;
        uVar9 = 0;
        iVar8 = 0;
        uVar6 = 0;
        do {
          if (-1 < pRVar3[uVar6] && 0 < (int)uVar2) {
            memcpy(pRVar4 + uVar9,aux + iVar8,(ulong)uVar2 * 8);
          }
          uVar6 = uVar6 + 1;
          iVar8 = iVar8 + ldim;
          uVar9 = (ulong)((int)uVar9 + uVar2);
        } while (uVar1 != uVar6);
      }
      return 0;
    }
    RVar5 = 2;
    pcVar7 = "malloc ref_node->aux of REF_DBL NULL";
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xa8a,
         "ref_node_store_aux",pcVar7);
  return RVar5;
}

Assistant:

REF_FCN REF_STATUS ref_node_store_aux(REF_NODE ref_node, REF_INT ldim,
                                      REF_DBL *aux) {
  REF_INT iaux, node;
  ref_node_naux(ref_node) = ldim;
  if (NULL != ref_node->aux) {
    ref_free(ref_node->aux);
    ref_node->aux = NULL;
  }
  ref_malloc(ref_node->aux, ref_node_naux(ref_node) * ref_node_max(ref_node),
             REF_DBL);
  each_ref_node_valid_node(ref_node, node) {
    for (iaux = 0; iaux < ref_node_naux(ref_node); iaux++) {
      ref_node_aux(ref_node, iaux, node) = aux[iaux + ldim * node];
    }
  }
  return REF_SUCCESS;
}